

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ParenthesizedConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax,slang::parsing::Token,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ConditionalDirectiveExpressionSyntax *args_1,
          Token *args_2)

{
  Token closeParen;
  Token openParen;
  ParenthesizedConditionalDirectiveExpressionSyntax *pPVar1;
  Info *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pPVar1 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  openParen.info = in_RSI;
  openParen.kind = (short)in_RDX;
  openParen._2_1_ = (char)((ulong)in_RDX >> 0x10);
  openParen.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  openParen.rawLen = (int)((ulong)in_RDX >> 0x20);
  closeParen.info = in_RCX;
  closeParen._0_8_ = in_RSI->location;
  slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax::
  ParenthesizedConditionalDirectiveExpressionSyntax
            ((ParenthesizedConditionalDirectiveExpressionSyntax *)in_RSI->rawTextPtr,openParen,
             (ConditionalDirectiveExpressionSyntax *)in_RCX->location,closeParen);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }